

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void ImGui::TabBarLayout(ImGuiTabBar *tab_bar)

{
  ImVector<ImGuiShrinkWidthItem> *this;
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  ImGuiWindow *pIVar4;
  bool bVar5;
  bool bVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  ImGuiTabItemFlags IVar11;
  int iVar12;
  int iVar13;
  ImGuiContext *pIVar14;
  float fVar15;
  float fVar16;
  ImGuiContext *pIVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  ImGuiID IVar21;
  ImGuiTabItem *pIVar22;
  ImGuiTabItem *pIVar23;
  char *pcVar24;
  ImGuiShrinkWidthItem *pIVar25;
  int iVar26;
  int tab_n_1;
  int tab_src_n;
  int iVar27;
  uint uVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  ImVec2 IVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float local_d8;
  ImGuiID local_c8;
  ImVec4 local_98;
  ImVec2 local_80;
  ImGuiTabItem item_tmp;
  
  pIVar17 = GImGui;
  tab_bar->WantLayout = false;
  iVar26 = 0;
  for (iVar27 = 0; iVar3 = (tab_bar->Tabs).Size, iVar27 < iVar3; iVar27 = iVar27 + 1) {
    pIVar22 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,iVar27);
    if (pIVar22->LastFrameVisible < tab_bar->PrevFrameVisible) {
      if (pIVar22->ID == tab_bar->SelectedTabId) {
        tab_bar->SelectedTabId = 0;
      }
    }
    else {
      if (iVar27 != iVar26) {
        pIVar22 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,iVar27);
        pIVar23 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,iVar26);
        IVar11 = pIVar22->Flags;
        iVar12 = pIVar22->LastFrameVisible;
        iVar13 = pIVar22->LastFrameSelected;
        iVar3 = pIVar22->NameOffset;
        fVar31 = pIVar22->Offset;
        fVar34 = pIVar22->Width;
        fVar29 = pIVar22->ContentWidth;
        pIVar23->ID = pIVar22->ID;
        pIVar23->Flags = IVar11;
        pIVar23->LastFrameVisible = iVar12;
        pIVar23->LastFrameSelected = iVar13;
        pIVar23->NameOffset = iVar3;
        pIVar23->Offset = fVar31;
        pIVar23->Width = fVar34;
        pIVar23->ContentWidth = fVar29;
      }
      iVar26 = iVar26 + 1;
    }
  }
  if (iVar3 != iVar26) {
    ImVector<ImGuiTabItem>::resize(&tab_bar->Tabs,iVar26);
  }
  local_c8 = tab_bar->NextSelectedTabId;
  if (local_c8 != 0) {
    tab_bar->SelectedTabId = local_c8;
    tab_bar->NextSelectedTabId = 0;
  }
  if (tab_bar->ReorderRequestTabId != 0) {
    pIVar22 = TabBarFindTabByID(tab_bar,tab_bar->ReorderRequestTabId);
    if (pIVar22 != (ImGuiTabItem *)0x0) {
      iVar26 = ImVector<ImGuiTabItem>::index_from_ptr(&tab_bar->Tabs,pIVar22);
      iVar26 = tab_bar->ReorderRequestDir + iVar26;
      if ((-1 < iVar26) && (iVar26 < (tab_bar->Tabs).Size)) {
        pIVar23 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,iVar26);
        item_tmp.ID = pIVar22->ID;
        item_tmp.Flags = pIVar22->Flags;
        item_tmp.LastFrameVisible = pIVar22->LastFrameVisible;
        item_tmp.LastFrameSelected = pIVar22->LastFrameSelected;
        item_tmp.NameOffset = pIVar22->NameOffset;
        item_tmp.Offset = pIVar22->Offset;
        item_tmp.Width = pIVar22->Width;
        item_tmp.ContentWidth = pIVar22->ContentWidth;
        IVar21 = pIVar23->ID;
        IVar11 = pIVar23->Flags;
        iVar26 = pIVar23->LastFrameVisible;
        iVar27 = pIVar23->LastFrameSelected;
        fVar31 = pIVar23->Offset;
        fVar34 = pIVar23->Width;
        fVar29 = pIVar23->ContentWidth;
        pIVar22->NameOffset = pIVar23->NameOffset;
        pIVar22->Offset = fVar31;
        pIVar22->Width = fVar34;
        pIVar22->ContentWidth = fVar29;
        pIVar22->ID = IVar21;
        pIVar22->Flags = IVar11;
        pIVar22->LastFrameVisible = iVar26;
        pIVar22->LastFrameSelected = iVar27;
        pIVar23->ID = item_tmp.ID;
        pIVar23->Flags = item_tmp.Flags;
        pIVar23->LastFrameVisible = item_tmp.LastFrameVisible;
        pIVar23->LastFrameSelected = item_tmp.LastFrameSelected;
        pIVar23->NameOffset = item_tmp.NameOffset;
        pIVar23->Offset = item_tmp.Offset;
        pIVar23->Width = item_tmp.Width;
        pIVar23->ContentWidth = item_tmp.ContentWidth;
        if (pIVar23->ID == tab_bar->SelectedTabId) {
          local_c8 = pIVar23->ID;
        }
      }
      if ((tab_bar->Flags & 0x400000) != 0) {
        MarkIniSettingsDirty();
      }
    }
    tab_bar->ReorderRequestTabId = 0;
  }
  pIVar14 = GImGui;
  if ((tab_bar->Flags & 4) != 0) {
    pIVar4 = GImGui->CurrentWindow;
    fVar31 = (GImGui->Style).FramePadding.y;
    fVar34 = GImGui->FontSize;
    IVar32 = (pIVar4->DC).CursorPos;
    fVar29 = (tab_bar->BarRect).Min.y;
    (pIVar4->DC).CursorPos.x = (tab_bar->BarRect).Min.x - fVar31;
    (pIVar4->DC).CursorPos.y = fVar29;
    (tab_bar->BarRect).Min.x = fVar34 + fVar31 + (tab_bar->BarRect).Min.x;
    item_tmp.ID = (ImGuiID)(pIVar14->Style).Colors[0].x;
    item_tmp.Flags = (ImGuiTabItemFlags)(pIVar14->Style).Colors[0].y;
    uVar7 = (pIVar14->Style).Colors[0].z;
    uVar8 = (pIVar14->Style).Colors[0].w;
    item_tmp.LastFrameSelected = (int)((float)uVar8 * 0.5);
    item_tmp.LastFrameVisible = uVar7;
    iVar26 = 0;
    PushStyleColor(0,(ImVec4 *)&item_tmp);
    local_98.x = 0.0;
    local_98.y = 0.0;
    local_98.z = 0.0;
    local_98.w = 0.0;
    PushStyleColor(0x15,&local_98);
    bVar18 = BeginCombo("##v",(char *)0x0,0x40);
    PopStyleColor(2);
    if (bVar18) {
      pIVar22 = (ImGuiTabItem *)0x0;
      for (; iVar26 < (tab_bar->Tabs).Size; iVar26 = iVar26 + 1) {
        pIVar23 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,iVar26);
        pcVar24 = ImGuiTabBar::GetTabName(tab_bar,pIVar23);
        local_98.x = 0.0;
        local_98.y = 0.0;
        bVar18 = Selectable(pcVar24,tab_bar->SelectedTabId == pIVar23->ID,0,(ImVec2 *)&local_98);
        if (bVar18) {
          pIVar22 = pIVar23;
        }
      }
      EndPopup();
      (pIVar4->DC).CursorPos = IVar32;
      if (pIVar22 != (ImGuiTabItem *)0x0) {
        local_c8 = pIVar22->ID;
        tab_bar->SelectedTabId = local_c8;
      }
    }
    else {
      (pIVar4->DC).CursorPos = IVar32;
    }
  }
  this = &pIVar17->ShrinkWidthBuffer;
  ImVector<ImGuiShrinkWidthItem>::resize(this,(tab_bar->Tabs).Size);
  local_d8 = 0.0;
  bVar18 = false;
  pIVar22 = (ImGuiTabItem *)0x0;
  for (iVar26 = 0; iVar27 = (tab_bar->Tabs).Size, iVar26 < iVar27; iVar26 = iVar26 + 1) {
    pIVar23 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,iVar26);
    if (pIVar23->LastFrameVisible < tab_bar->PrevFrameVisible) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                  ,0x1a7d,"TabBarLayout","ImGui ASSERT FAILED: %s",
                  "tab->LastFrameVisible >= tab_bar->PrevFrameVisible");
    }
    if ((pIVar22 == (ImGuiTabItem *)0x0) ||
       (pIVar22->LastFrameSelected < pIVar23->LastFrameSelected)) {
      pIVar22 = pIVar23;
    }
    if (pIVar23->ID == tab_bar->SelectedTabId) {
      bVar18 = true;
    }
    pcVar24 = ImGuiTabBar::GetTabName(tab_bar,pIVar23);
    IVar32 = TabItemCalcSize(pcVar24,((uint)pIVar23->Flags >> 0x14 & 1) == 0);
    pIVar23->ContentWidth = IVar32.x;
    if (iVar26 == 0) {
      fVar31 = 0.0;
    }
    else {
      fVar31 = (pIVar17->Style).ItemInnerSpacing.x;
    }
    local_d8 = local_d8 + IVar32.x + fVar31;
    pIVar25 = ImVector<ImGuiShrinkWidthItem>::operator[](this,iVar26);
    pIVar25->Index = iVar26;
    fVar31 = pIVar23->ContentWidth;
    pIVar25 = ImVector<ImGuiShrinkWidthItem>::operator[](this,iVar26);
    pIVar25->Width = fVar31;
  }
  fVar31 = (tab_bar->BarRect).Max.x - (tab_bar->BarRect).Min.x;
  fVar31 = (float)(-(uint)(0.0 <= fVar31) & (uint)fVar31);
  fVar31 = (float)(-(uint)(fVar31 < local_d8) & (uint)(local_d8 - fVar31));
  if ((fVar31 <= 0.0) || ((tab_bar->Flags & 0x40) == 0)) {
    fVar31 = GImGui->FontSize * 20.0;
    for (iVar26 = 0; iVar26 < iVar27; iVar26 = iVar26 + 1) {
      pIVar23 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,iVar26);
      fVar34 = pIVar23->ContentWidth;
      if (fVar31 <= pIVar23->ContentWidth) {
        fVar34 = fVar31;
      }
      pIVar23->Width = fVar34;
      if (fVar34 <= 0.0) {
        LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                    ,0x1aa4,"TabBarLayout","ImGui ASSERT FAILED: %s","tab->Width > 0.0f");
      }
      iVar27 = (tab_bar->Tabs).Size;
    }
  }
  else {
    ShrinkWidths((pIVar17->ShrinkWidthBuffer).Data,(pIVar17->ShrinkWidthBuffer).Size,fVar31);
    for (iVar26 = 0; iVar27 = (tab_bar->Tabs).Size, iVar26 < iVar27; iVar26 = iVar26 + 1) {
      pIVar25 = ImVector<ImGuiShrinkWidthItem>::operator[](this,iVar26);
      fVar31 = pIVar25->Width;
      pIVar25 = ImVector<ImGuiShrinkWidthItem>::operator[](this,iVar26);
      pIVar23 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,pIVar25->Index);
      pIVar23->Width = (float)(int)fVar31;
    }
  }
  tab_bar->OffsetNextTab = 0.0;
  fVar31 = 0.0;
  fVar34 = 0.0;
  for (iVar26 = 0; iVar26 < iVar27; iVar26 = iVar26 + 1) {
    pIVar23 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,iVar26);
    pIVar23->Offset = fVar31;
    if ((local_c8 == 0) && (local_c8 = pIVar23->ID, pIVar17->NavJustMovedToId != local_c8)) {
      local_c8 = 0;
    }
    uVar1 = pIVar23->Width;
    uVar2 = pIVar23->ContentWidth;
    fVar29 = (pIVar17->Style).ItemInnerSpacing.x;
    fVar31 = fVar31 + fVar29 + (float)uVar1;
    fVar34 = fVar34 + fVar29 + (float)uVar2;
    iVar27 = (tab_bar->Tabs).Size;
  }
  fVar29 = (pIVar17->Style).ItemInnerSpacing.x;
  fVar31 = fVar31 - fVar29;
  fVar34 = fVar34 - fVar29;
  fVar31 = (float)(-(uint)(0.0 <= fVar31) & (uint)fVar31);
  tab_bar->OffsetMax = fVar31;
  pIVar14 = GImGui;
  tab_bar->OffsetMaxIdeal = (float)(-(uint)(0.0 <= fVar34) & (uint)fVar34);
  if (1 < iVar27) {
    fVar34 = (tab_bar->BarRect).Min.x;
    fVar29 = (tab_bar->BarRect).Max.x;
    if ((fVar29 - fVar34 < fVar31) && ((tab_bar->Flags & 0x90U) == 0x80)) {
      pIVar4 = GImGui->CurrentWindow;
      fVar35 = GImGui->FontSize + -2.0;
      fVar31 = (GImGui->Style).FramePadding.y;
      IVar32.y = fVar31 + fVar31 + GImGui->FontSize;
      IVar32.x = fVar35;
      fVar36 = fVar35 + fVar35;
      local_80 = (pIVar4->DC).CursorPos;
      fVar31 = (tab_bar->BarRect).Max.y;
      fVar30 = local_80.x;
      fVar33 = local_80.y;
      bVar6 = fVar33 < (tab_bar->BarRect).Min.y;
      bVar5 = fVar29 < fVar36 + fVar30;
      if ((fVar31 < fVar33 || (bVar6 || fVar30 < fVar34)) || bVar5) {
        item_tmp.Flags = (ImGuiTabItemFlags)(fVar31 + 0.0);
        item_tmp.ID = (ImGuiID)((GImGui->Style).ItemInnerSpacing.x + fVar29);
        PushClipRect(&(tab_bar->BarRect).Min,(ImVec2 *)&item_tmp,true);
      }
      item_tmp.ID = (ImGuiID)(pIVar14->Style).Colors[0].x;
      item_tmp.Flags = (ImGuiTabItemFlags)(pIVar14->Style).Colors[0].y;
      uVar9 = (pIVar14->Style).Colors[0].z;
      uVar10 = (pIVar14->Style).Colors[0].w;
      item_tmp.LastFrameSelected = (int)((float)uVar10 * 0.5);
      item_tmp.LastFrameVisible = uVar9;
      PushStyleColor(0,(ImVec4 *)&item_tmp);
      local_98.x = 0.0;
      local_98.y = 0.0;
      local_98.z = 0.0;
      local_98.w = 0.0;
      PushStyleColor(0x15,&local_98);
      fVar15 = (pIVar14->IO).KeyRepeatDelay;
      fVar16 = (pIVar14->IO).KeyRepeatRate;
      (pIVar14->IO).KeyRepeatDelay = 0.25;
      (pIVar14->IO).KeyRepeatRate = 0.2;
      fVar29 = (tab_bar->BarRect).Min.y;
      (pIVar4->DC).CursorPos.x = (tab_bar->BarRect).Max.x - fVar36;
      (pIVar4->DC).CursorPos.y = fVar29;
      bVar19 = ArrowButtonEx("##<",0,IVar32,3);
      fVar29 = (tab_bar->BarRect).Min.y;
      (pIVar4->DC).CursorPos.x = fVar35 + ((tab_bar->BarRect).Max.x - fVar36);
      (pIVar4->DC).CursorPos.y = fVar29;
      bVar20 = ArrowButtonEx("##>",1,IVar32,3);
      iVar26 = -(uint)bVar19;
      if (bVar20) {
        iVar26 = 1;
      }
      PopStyleColor(2);
      (pIVar14->IO).KeyRepeatDelay = fVar15;
      (pIVar14->IO).KeyRepeatRate = fVar16;
      if ((fVar31 < fVar33 || (bVar6 || fVar30 < fVar34)) || bVar5) {
        PopClipRect();
      }
      if ((iVar26 == 0) ||
         (pIVar23 = TabBarFindTabByID(tab_bar,tab_bar->SelectedTabId),
         pIVar23 == (ImGuiTabItem *)0x0)) {
        pIVar23 = (ImGuiTabItem *)0x0;
      }
      else {
        iVar27 = ImVector<ImGuiTabItem>::index_from_ptr(&tab_bar->Tabs,pIVar23);
        iVar26 = iVar26 + iVar27;
        if ((iVar26 < 0) || ((tab_bar->Tabs).Size <= iVar26)) {
          iVar26 = iVar27;
        }
        pIVar23 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,iVar26);
      }
      (pIVar4->DC).CursorPos = local_80;
      (tab_bar->BarRect).Max.x = (tab_bar->BarRect).Max.x - (fVar36 + 1.0);
      if (pIVar23 != (ImGuiTabItem *)0x0) {
        local_c8 = pIVar23->ID;
        tab_bar->SelectedTabId = local_c8;
      }
    }
  }
  if (bVar18) {
    IVar21 = tab_bar->SelectedTabId;
    if (IVar21 == 0) goto LAB_001c294b;
  }
  else {
    tab_bar->SelectedTabId = 0;
LAB_001c294b:
    IVar21 = 0;
    if ((tab_bar->NextSelectedTabId == 0) && (IVar21 = 0, pIVar22 != (ImGuiTabItem *)0x0)) {
      IVar21 = pIVar22->ID;
      tab_bar->SelectedTabId = IVar21;
      local_c8 = IVar21;
    }
  }
  tab_bar->VisibleTabId = IVar21;
  tab_bar->VisibleTabWasSubmitted = false;
  if ((local_c8 != 0) &&
     (pIVar22 = TabBarFindTabByID(tab_bar,local_c8), pIVar22 != (ImGuiTabItem *)0x0)) {
    fVar31 = GImGui->FontSize;
    iVar26 = ImVector<ImGuiTabItem>::index_from_ptr(&tab_bar->Tabs,pIVar22);
    fVar34 = pIVar22->Offset;
    fVar29 = fVar31;
    if (iVar26 < 1) {
      fVar29 = -0.0;
    }
    fVar30 = pIVar22->Width;
    fVar29 = fVar34 - fVar29;
    if ((tab_bar->Tabs).Size <= iVar26 + 1) {
      fVar31 = 1.0;
    }
    tab_bar->ScrollingTargetDistToVisibility = 0.0;
    fVar31 = fVar34 + fVar30 + fVar31;
    if ((fVar29 < tab_bar->ScrollingTarget) ||
       (fVar34 = (tab_bar->BarRect).Max.x - (tab_bar->BarRect).Min.x, fVar34 <= fVar31 - fVar29)) {
      fVar30 = tab_bar->ScrollingAnim - fVar31;
    }
    else {
      if (fVar31 - fVar34 <= tab_bar->ScrollingTarget) goto LAB_001c2a3d;
      fVar30 = (fVar29 - fVar34) - tab_bar->ScrollingAnim;
      fVar29 = fVar31 - fVar34;
    }
    tab_bar->ScrollingTargetDistToVisibility = (float)(-(uint)(0.0 <= fVar30) & (uint)fVar30);
    tab_bar->ScrollingTarget = fVar29;
  }
LAB_001c2a3d:
  fVar31 = TabBarScrollClamp(tab_bar,tab_bar->ScrollingAnim);
  tab_bar->ScrollingAnim = fVar31;
  fVar34 = TabBarScrollClamp(tab_bar,tab_bar->ScrollingTarget);
  tab_bar->ScrollingTarget = fVar34;
  if ((fVar31 != fVar34) || (NAN(fVar31) || NAN(fVar34))) {
    fVar29 = pIVar17->FontSize;
    fVar30 = fVar29 * 70.0;
    uVar28 = -(uint)(fVar30 <= tab_bar->ScrollingSpeed);
    fVar33 = ABS(fVar34 - fVar31) / 0.3;
    fVar30 = (float)(~uVar28 & (uint)fVar30 | (uint)tab_bar->ScrollingSpeed & uVar28);
    uVar28 = -(uint)(fVar33 <= fVar30);
    fVar33 = (float)(~uVar28 & (uint)fVar33 | uVar28 & (uint)fVar30);
    tab_bar->ScrollingSpeed = fVar33;
    fVar30 = fVar34;
    if ((pIVar17->FrameCount <= tab_bar->PrevFrameVisible + 1) &&
       (tab_bar->ScrollingTargetDistToVisibility <= fVar29 * 10.0)) {
      fVar33 = fVar33 * (pIVar17->IO).DeltaTime;
      if (fVar34 <= fVar31) {
        fVar30 = fVar31;
        if (fVar34 < fVar31) {
          fVar31 = fVar31 - fVar33;
          uVar28 = -(uint)(fVar34 <= fVar31);
          fVar30 = (float)((uint)fVar31 & uVar28 | ~uVar28 & (uint)fVar34);
        }
      }
      else {
        fVar30 = fVar31 + fVar33;
        if (fVar34 <= fVar30) {
          fVar30 = fVar34;
        }
      }
    }
    tab_bar->ScrollingAnim = fVar30;
  }
  else {
    tab_bar->ScrollingSpeed = 0.0;
  }
  if ((tab_bar->Flags & 0x100000) == 0) {
    ImVector<char>::resize(&(tab_bar->TabsNames).Buf,0);
  }
  return;
}

Assistant:

static void ImGui::TabBarLayout(ImGuiTabBar* tab_bar)
{
    ImGuiContext& g = *GImGui;
    tab_bar->WantLayout = false;

    // Garbage collect
    int tab_dst_n = 0;
    for (int tab_src_n = 0; tab_src_n < tab_bar->Tabs.Size; tab_src_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_src_n];
        if (tab->LastFrameVisible < tab_bar->PrevFrameVisible)
        {
            if (tab->ID == tab_bar->SelectedTabId)
                tab_bar->SelectedTabId = 0;
            continue;
        }
        if (tab_dst_n != tab_src_n)
            tab_bar->Tabs[tab_dst_n] = tab_bar->Tabs[tab_src_n];
        tab_dst_n++;
    }
    if (tab_bar->Tabs.Size != tab_dst_n)
        tab_bar->Tabs.resize(tab_dst_n);

    // Setup next selected tab
    ImGuiID scroll_track_selected_tab_id = 0;
    if (tab_bar->NextSelectedTabId)
    {
        tab_bar->SelectedTabId = tab_bar->NextSelectedTabId;
        tab_bar->NextSelectedTabId = 0;
        scroll_track_selected_tab_id = tab_bar->SelectedTabId;
    }

    // Process order change request (we could probably process it when requested but it's just saner to do it in a single spot).
    if (tab_bar->ReorderRequestTabId != 0)
    {
        if (ImGuiTabItem* tab1 = TabBarFindTabByID(tab_bar, tab_bar->ReorderRequestTabId))
        {
            //IM_ASSERT(tab_bar->Flags & ImGuiTabBarFlags_Reorderable); // <- this may happen when using debug tools
            int tab2_order = tab_bar->GetTabOrder(tab1) + tab_bar->ReorderRequestDir;
            if (tab2_order >= 0 && tab2_order < tab_bar->Tabs.Size)
            {
                ImGuiTabItem* tab2 = &tab_bar->Tabs[tab2_order];
                ImGuiTabItem item_tmp = *tab1;
                *tab1 = *tab2;
                *tab2 = item_tmp;
                if (tab2->ID == tab_bar->SelectedTabId)
                    scroll_track_selected_tab_id = tab2->ID;
                tab1 = tab2 = NULL;
            }
            if (tab_bar->Flags & ImGuiTabBarFlags_SaveSettings)
                MarkIniSettingsDirty();
        }
        tab_bar->ReorderRequestTabId = 0;
    }

    // Tab List Popup (will alter tab_bar->BarRect and therefore the available width!)
    const bool tab_list_popup_button = (tab_bar->Flags & ImGuiTabBarFlags_TabListPopupButton) != 0;
    if (tab_list_popup_button)
        if (ImGuiTabItem* tab_to_select = TabBarTabListPopupButton(tab_bar)) // NB: Will alter BarRect.Max.x!
            scroll_track_selected_tab_id = tab_bar->SelectedTabId = tab_to_select->ID;

    // Compute ideal widths
    g.ShrinkWidthBuffer.resize(tab_bar->Tabs.Size);
    float width_total_contents = 0.0f;
    ImGuiTabItem* most_recently_selected_tab = NULL;
    bool found_selected_tab_id = false;
    for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
        IM_ASSERT(tab->LastFrameVisible >= tab_bar->PrevFrameVisible);

        if (most_recently_selected_tab == NULL || most_recently_selected_tab->LastFrameSelected < tab->LastFrameSelected)
            most_recently_selected_tab = tab;
        if (tab->ID == tab_bar->SelectedTabId)
            found_selected_tab_id = true;

        // Refresh tab width immediately, otherwise changes of style e.g. style.FramePadding.x would noticeably lag in the tab bar.
        // Additionally, when using TabBarAddTab() to manipulate tab bar order we occasionally insert new tabs that don't have a width yet,
        // and we cannot wait for the next BeginTabItem() call. We cannot compute this width within TabBarAddTab() because font size depends on the active window.
        const char* tab_name = tab_bar->GetTabName(tab);
        const bool has_close_button = (tab->Flags & ImGuiTabItemFlags_NoCloseButton) ? false : true;
        tab->ContentWidth = TabItemCalcSize(tab_name, has_close_button).x;

        width_total_contents += (tab_n > 0 ? g.Style.ItemInnerSpacing.x : 0.0f) + tab->ContentWidth;

        // Store data so we can build an array sorted by width if we need to shrink tabs down
        g.ShrinkWidthBuffer[tab_n].Index = tab_n;
        g.ShrinkWidthBuffer[tab_n].Width = tab->ContentWidth;
    }

    // Compute width
    const float initial_offset_x = 0.0f; // g.Style.ItemInnerSpacing.x;
    const float width_avail = ImMax(tab_bar->BarRect.GetWidth() - initial_offset_x, 0.0f);
    float width_excess = (width_avail < width_total_contents) ? (width_total_contents - width_avail) : 0.0f;
    if (width_excess > 0.0f && (tab_bar->Flags & ImGuiTabBarFlags_FittingPolicyResizeDown))
    {
        // If we don't have enough room, resize down the largest tabs first
        ShrinkWidths(g.ShrinkWidthBuffer.Data, g.ShrinkWidthBuffer.Size, width_excess);
        for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
            tab_bar->Tabs[g.ShrinkWidthBuffer[tab_n].Index].Width = IM_FLOOR(g.ShrinkWidthBuffer[tab_n].Width);
    }
    else
    {
        const float tab_max_width = TabBarCalcMaxTabWidth();
        for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
        {
            ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
            tab->Width = ImMin(tab->ContentWidth, tab_max_width);
            IM_ASSERT(tab->Width > 0.0f);
        }
    }

    // Layout all active tabs
    float offset_x = initial_offset_x;
    float offset_x_ideal = offset_x;
    tab_bar->OffsetNextTab = offset_x; // This is used by non-reorderable tab bar where the submission order is always honored.
    for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
        tab->Offset = offset_x;
        if (scroll_track_selected_tab_id == 0 && g.NavJustMovedToId == tab->ID)
            scroll_track_selected_tab_id = tab->ID;
        offset_x += tab->Width + g.Style.ItemInnerSpacing.x;
        offset_x_ideal += tab->ContentWidth + g.Style.ItemInnerSpacing.x;
    }
    tab_bar->OffsetMax = ImMax(offset_x - g.Style.ItemInnerSpacing.x, 0.0f);
    tab_bar->OffsetMaxIdeal = ImMax(offset_x_ideal - g.Style.ItemInnerSpacing.x, 0.0f);

    // Horizontal scrolling buttons
    const bool scrolling_buttons = (tab_bar->OffsetMax > tab_bar->BarRect.GetWidth() && tab_bar->Tabs.Size > 1) && !(tab_bar->Flags & ImGuiTabBarFlags_NoTabListScrollingButtons) && (tab_bar->Flags & ImGuiTabBarFlags_FittingPolicyScroll);
    if (scrolling_buttons)
        if (ImGuiTabItem* tab_to_select = TabBarScrollingButtons(tab_bar)) // NB: Will alter BarRect.Max.x!
            scroll_track_selected_tab_id = tab_bar->SelectedTabId = tab_to_select->ID;

    // If we have lost the selected tab, select the next most recently active one
    if (found_selected_tab_id == false)
        tab_bar->SelectedTabId = 0;
    if (tab_bar->SelectedTabId == 0 && tab_bar->NextSelectedTabId == 0 && most_recently_selected_tab != NULL)
        scroll_track_selected_tab_id = tab_bar->SelectedTabId = most_recently_selected_tab->ID;

    // Lock in visible tab
    tab_bar->VisibleTabId = tab_bar->SelectedTabId;
    tab_bar->VisibleTabWasSubmitted = false;

    // Update scrolling
    if (scroll_track_selected_tab_id)
        if (ImGuiTabItem* scroll_track_selected_tab = TabBarFindTabByID(tab_bar, scroll_track_selected_tab_id))
            TabBarScrollToTab(tab_bar, scroll_track_selected_tab);
    tab_bar->ScrollingAnim = TabBarScrollClamp(tab_bar, tab_bar->ScrollingAnim);
    tab_bar->ScrollingTarget = TabBarScrollClamp(tab_bar, tab_bar->ScrollingTarget);
    if (tab_bar->ScrollingAnim != tab_bar->ScrollingTarget)
    {
        // Scrolling speed adjust itself so we can always reach our target in 1/3 seconds.
        // Teleport if we are aiming far off the visible line
        tab_bar->ScrollingSpeed = ImMax(tab_bar->ScrollingSpeed, 70.0f * g.FontSize);
        tab_bar->ScrollingSpeed = ImMax(tab_bar->ScrollingSpeed, ImFabs(tab_bar->ScrollingTarget - tab_bar->ScrollingAnim) / 0.3f);
        const bool teleport = (tab_bar->PrevFrameVisible + 1 < g.FrameCount) || (tab_bar->ScrollingTargetDistToVisibility > 10.0f * g.FontSize);
        tab_bar->ScrollingAnim = teleport ? tab_bar->ScrollingTarget : ImLinearSweep(tab_bar->ScrollingAnim, tab_bar->ScrollingTarget, g.IO.DeltaTime * tab_bar->ScrollingSpeed);
    }
    else
    {
        tab_bar->ScrollingSpeed = 0.0f;
    }

    // Clear name buffers
    if ((tab_bar->Flags & ImGuiTabBarFlags_DockNode) == 0)
        tab_bar->TabsNames.Buf.resize(0);
}